

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::RendererImpl<short>::doRenderAndConvert<float>
          (RendererImpl<short> *this,float *stereoStream,Bit32u len)

{
  Bit32u local_403c;
  short local_4028 [2];
  Bit32u thisPassLen;
  short renderingBuffer [8192];
  uint local_1c;
  float *pfStack_18;
  Bit32u len_local;
  float *stereoStream_local;
  RendererImpl<short> *this_local;
  
  pfStack_18 = stereoStream;
  for (local_1c = len; local_1c != 0; local_1c = local_1c - local_403c) {
    if (local_1c < 0x1001) {
      local_403c = local_1c;
    }
    else {
      local_403c = 0x1000;
    }
    doRender(this,local_4028,local_403c);
    convertSampleFormat<short,float>(local_4028,pfStack_18,local_403c << 1);
    pfStack_18 = pfStack_18 + (local_403c << 1);
  }
  return;
}

Assistant:

void RendererImpl<Sample>::doRenderAndConvert(O *stereoStream, Bit32u len) {
	Sample renderingBuffer[MAX_SAMPLES_PER_RUN << 1];
	while (len > 0) {
		Bit32u thisPassLen = len > MAX_SAMPLES_PER_RUN ? MAX_SAMPLES_PER_RUN : len;
		doRender(renderingBuffer, thisPassLen);
		convertSampleFormat(renderingBuffer, stereoStream, thisPassLen << 1);
		stereoStream += thisPassLen << 1;
		len -= thisPassLen;
	}
}